

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O1

void __thiscall ON_CurveArray::Destroy(ON_CurveArray *this)

{
  ON_Curve *pOVar1;
  ON_Curve **__s;
  long lVar2;
  
  lVar2 = (long)(this->super_ON_SimpleArray<ON_Curve_*>).m_capacity;
  if (0 < lVar2) {
    lVar2 = lVar2 + 1;
    do {
      pOVar1 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar2 + -2];
      if (pOVar1 != (ON_Curve *)0x0) {
        (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar2 + -2] = (ON_Curve *)0x0;
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  __s = (this->super_ON_SimpleArray<ON_Curve_*>).m_a;
  if (__s != (ON_Curve **)0x0) {
    memset(__s,0,(long)(this->super_ON_SimpleArray<ON_Curve_*>).m_capacity << 3);
  }
  (this->super_ON_SimpleArray<ON_Curve_*>).m_count = 0;
  return;
}

Assistant:

void ON_CurveArray::Destroy()
{
  int i = m_capacity;
  while ( i-- > 0 ) {
    if ( m_a[i] ) {
      delete m_a[i];
      m_a[i] = nullptr;
    }
  }
  Empty();
}